

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O2

void __thiscall cmParseCacheCoverage::RemoveUnCoveredFiles(cmParseCacheCoverage *this)

{
  cmCTest *this_00;
  _Rb_tree_color *p_Var1;
  iterator __position;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Self __tmp;
  cmCTestCoverageHandlerContainer *pcVar5;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  pcVar5 = (this->super_cmParseMumpsCoverage).Coverage;
  __position._M_node = (pcVar5->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0016e290:
  do {
    if ((_Rb_tree_header *)__position._M_node ==
        &(pcVar5->TotalCoverage)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var4 = *(_Base_ptr *)(__position._M_node + 2);
    do {
      if (p_Var4 == __position._M_node[2]._M_parent) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"No coverage found in: ");
        poVar2 = std::operator<<(poVar2,(string *)(__position._M_node + 1));
        std::endl<char,std::char_traits<char>>(poVar2);
        this_00 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x41,local_1c8[0],((this->super_cmParseMumpsCoverage).Coverage)->Quiet);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        pcVar5 = (this->super_cmParseMumpsCoverage).Coverage;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>
                            *)&pcVar5->TotalCoverage,__position);
        pcVar5 = (this->super_cmParseMumpsCoverage).Coverage;
        __position._M_node = p_Var3;
        goto LAB_0016e290;
      }
      p_Var1 = &p_Var4->_M_color;
      p_Var4 = (_Base_ptr)&p_Var4->field_0x4;
    } while ((int)*p_Var1 < 1);
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void cmParseCacheCoverage::RemoveUnCoveredFiles()
{
  // loop over the coverage data computed and remove all files
  // that only have -1 or 0 for the lines.
  cmCTestCoverageHandlerContainer::TotalCoverageMap::iterator ci =
    this->Coverage.TotalCoverage.begin();
  while (ci != this->Coverage.TotalCoverage.end()) {
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& v = ci->second;
    bool nothing = true;
    for (int i : v) {
      if (i > 0) {
        nothing = false;
        break;
      }
    }
    if (nothing) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "No coverage found in: " << ci->first << std::endl,
                         this->Coverage.Quiet);
      this->Coverage.TotalCoverage.erase(ci++);
    } else {
      ++ci;
    }
  }
}